

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O0

void __thiscall cnn::AlignedMemoryPool<6U>::sys_alloc(AlignedMemoryPool<6U> *this,size_t cap)

{
  size_t sVar1;
  void *pvVar2;
  size_t in_RSI;
  size_t *in_RDI;
  size_t in_stack_00000038;
  size_t in_stack_00000040;
  
  sVar1 = round_up_align(in_RSI);
  *in_RDI = sVar1;
  if ((in_RDI[2] & 1) == 0) {
    pvVar2 = cnn_mm_malloc(in_stack_00000040,in_stack_00000038);
    in_RDI[3] = (size_t)pvVar2;
  }
  else {
    pvVar2 = mmap((void *)0x0,*in_RDI,3,0x21,-1,0);
    in_RDI[3] = (size_t)pvVar2;
  }
  in_RDI[1] = 0;
  return;
}

Assistant:

void sys_alloc(size_t cap) {
    capacity = round_up_align(cap);
    if (shared) {
      mem = mmap(NULL, capacity, PROT_READ|PROT_WRITE, MAP_ANON|MAP_SHARED, -1, 0);
    }
    else {
      mem = cnn_mm_malloc(capacity, 1 << AlignedBits);
    }
    used = 0;
  }